

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  bool bVar1;
  byte bVar2;
  OfType OVar3;
  AssertionResult *this_00;
  pointer pMVar4;
  ostream *poVar5;
  string local_2f8 [32];
  SourceLineInfo local_2d8;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  local_2b0;
  const_iterator itEnd;
  const_iterator it;
  undefined1 local_280 [40];
  ostringstream oss;
  undefined1 local_e8 [40];
  string local_c0 [32];
  undefined1 local_a0 [40];
  string local_78 [32];
  undefined1 local_58 [8];
  ScopedElement e;
  string elementName;
  AssertionResult *result;
  AssertionStats *stats_local;
  JunitReporter *this_local;
  
  this_00 = &stats->assertionResult;
  bVar1 = AssertionResult::isOk(this_00);
  if (bVar1) {
    return;
  }
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc0);
  OVar3 = AssertionResult::getResultType(this_00);
  if ((3 < (uint)(OVar3 + Info)) && (OVar3 != FailureBit)) {
    if (OVar3 == ExpressionFailed) {
      std::__cxx11::string::operator=((string *)&stack0xffffffffffffffc0,"failure");
      goto LAB_001c1438;
    }
    if (OVar3 == ExplicitFailure) {
      std::__cxx11::string::operator=((string *)&stack0xffffffffffffffc0,"failure");
      goto LAB_001c1438;
    }
    if (OVar3 != Exception) {
      if (OVar3 != ThrewException) {
        if (OVar3 == DidntThrowException) {
          std::__cxx11::string::operator=((string *)&stack0xffffffffffffffc0,"failure");
          goto LAB_001c1438;
        }
        if (OVar3 != FatalErrorCondition) goto LAB_001c1438;
      }
      std::__cxx11::string::operator=((string *)&stack0xffffffffffffffc0,"error");
      goto LAB_001c1438;
    }
  }
  std::__cxx11::string::operator=((string *)&stack0xffffffffffffffc0,"internalError");
LAB_001c1438:
  XmlWriter::scopedElement((XmlWriter *)local_58,(string *)&this->xml);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"message",(allocator *)(local_a0 + 0x27));
  AssertionResult::getExpandedExpression_abi_cxx11_((AssertionResult *)local_a0);
  XmlWriter::writeAttribute(&this->xml,(string *)local_78,(string *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)(local_a0 + 0x27));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"type",(allocator *)(local_e8 + 0x27));
  AssertionResult::getTestMacroName_abi_cxx11_((AssertionResult *)local_e8);
  XmlWriter::writeAttribute(&this->xml,(string *)local_c0,(string *)local_e8);
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator((allocator<char> *)(local_e8 + 0x27));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_280 + 0x20));
  AssertionResult::getMessage_abi_cxx11_((AssertionResult *)local_280);
  bVar2 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)local_280);
  if (((bVar2 ^ 0xff) & 1) != 0) {
    AssertionResult::getMessage_abi_cxx11_((AssertionResult *)&it);
    poVar5 = std::operator<<((ostream *)(local_280 + 0x20),(string *)&it);
    std::operator<<(poVar5,"\n");
    std::__cxx11::string::~string((string *)&it);
  }
  itEnd = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                    (&stats->infoMessages);
  local_2b0._M_current =
       (MessageInfo *)
       std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                 (&stats->infoMessages);
  while (bVar1 = __gnu_cxx::operator!=(&itEnd,&local_2b0), bVar1) {
    pMVar4 = __gnu_cxx::
             __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
             ::operator->(&itEnd);
    if (pMVar4->type == Info) {
      pMVar4 = __gnu_cxx::
               __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
               ::operator->(&itEnd);
      poVar5 = std::operator<<((ostream *)(local_280 + 0x20),(string *)&pMVar4->message);
      std::operator<<(poVar5,"\n");
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
    ::operator++(&itEnd);
  }
  poVar5 = std::operator<<((ostream *)(local_280 + 0x20),"at ");
  AssertionResult::getSourceInfo(&local_2d8,this_00);
  Catch::operator<<(poVar5,&local_2d8);
  SourceLineInfo::~SourceLineInfo(&local_2d8);
  std::__cxx11::ostringstream::str();
  XmlWriter::writeText(&this->xml,local_2f8,false);
  std::__cxx11::string::~string((string *)local_2f8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_280 + 0x20));
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_58);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void writeAssertion( AssertionStats const& stats ) {
            AssertionResult const& result = stats.assertionResult;
            if( !result.isOk() ) {
                std::string elementName;
                switch( result.getResultType() ) {
                    case ResultWas::ThrewException:
                    case ResultWas::FatalErrorCondition:
                        elementName = "error";
                        break;
                    case ResultWas::ExplicitFailure:
                        elementName = "failure";
                        break;
                    case ResultWas::ExpressionFailed:
                        elementName = "failure";
                        break;
                    case ResultWas::DidntThrowException:
                        elementName = "failure";
                        break;

                    // We should never see these here:
                    case ResultWas::Info:
                    case ResultWas::Warning:
                    case ResultWas::Ok:
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        elementName = "internalError";
                        break;
                }

                XmlWriter::ScopedElement e = xml.scopedElement( elementName );

                xml.writeAttribute( "message", result.getExpandedExpression() );
                xml.writeAttribute( "type", result.getTestMacroName() );

                std::ostringstream oss;
                if( !result.getMessage().empty() )
                    oss << result.getMessage() << "\n";
                for( std::vector<MessageInfo>::const_iterator
                        it = stats.infoMessages.begin(),
                        itEnd = stats.infoMessages.end();
                            it != itEnd;
                            ++it )
                    if( it->type == ResultWas::Info )
                        oss << it->message << "\n";

                oss << "at " << result.getSourceInfo();
                xml.writeText( oss.str(), false );
            }
        }